

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_scalar_plt
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,REF_BOOL as_brick,
          char *filename)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_MPI pRVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  FILE *__s;
  size_t sVar6;
  undefined8 uVar7;
  undefined4 in_register_00000034;
  char *pcVar8;
  int iVar9;
  long lVar10;
  size_t __n;
  char cVar11;
  ulong uVar12;
  int celldim;
  REF_INT max_faceid;
  int numelements;
  int numpts;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  int notused;
  int strandid;
  int parentzone;
  float zonemarker;
  REF_GLOB *l2c;
  REF_INT min_faceid;
  REF_GLOB nnode;
  REF_LONG ncell;
  double solutiontime;
  float eohmarker;
  int numvar;
  int filetype;
  int one;
  char zonename [256];
  char default_name [1000];
  int ascii [1024];
  undefined4 local_15b8;
  int local_15b4;
  ulong local_15b0;
  undefined4 local_15a4;
  undefined4 local_15a0;
  undefined4 local_159c;
  undefined4 local_1598;
  undefined4 local_1594;
  undefined4 local_1590;
  undefined4 local_158c;
  undefined4 local_1588;
  undefined4 local_1584;
  undefined4 local_1580;
  undefined4 local_157c;
  REF_GLOB *local_1578;
  REF_BOOL local_1570;
  uint local_156c;
  long local_1568;
  long local_1560;
  undefined8 local_1558;
  undefined4 local_1550;
  int local_154c;
  undefined4 local_1548;
  undefined4 local_1544;
  undefined8 local_1540;
  char local_1538 [256];
  int local_1438 [256];
  undefined8 local_1038;
  undefined4 local_1030;
  
  local_15b0 = CONCAT44(in_register_00000034,ldim);
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_1544 = 1;
  local_1548 = 0;
  local_154c = ldim + 3;
  local_1550 = 0x43b28000;
  local_1570 = as_brick;
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"reset timing");
  }
  uVar3 = ref_node_synchronize_globals(ref_node);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x10a0
           ,"ref_gather_scalar_plt",(ulong)uVar3,"sync");
    return uVar3;
  }
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"header sync global");
  }
  uVar3 = 0;
  if (ref_mpi->id == 0) {
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10a7,"ref_gather_scalar_plt","unable to open file");
      return 2;
    }
    sVar6 = fwrite("#!TDV112",1,8,__s);
    if (sVar6 != 8) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10a9,"ref_gather_scalar_plt","header",8,sVar6);
      return 1;
    }
    sVar6 = fwrite(&local_1544,4,1,__s);
    if (sVar6 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10aa,"ref_gather_scalar_plt","magic",1,sVar6);
      return 1;
    }
    sVar6 = fwrite(&local_1548,4,1,__s);
    if (sVar6 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10ab,"ref_gather_scalar_plt","filetype",1,sVar6);
      return 1;
    }
    local_1038 = 0x7400000066;
    local_1030 = 0;
    sVar6 = fwrite(&local_1038,4,3,__s);
    if (sVar6 != 3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10b0,"ref_gather_scalar_plt","title",3,sVar6);
      return 1;
    }
    sVar6 = fwrite(&local_154c,4,1,__s);
    if (sVar6 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10b2,"ref_gather_scalar_plt","numvar",1,sVar6);
      return 1;
    }
    local_1038 = 0x78;
    sVar6 = fwrite(&local_1038,4,2,__s);
    if (sVar6 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10b5,"ref_gather_scalar_plt","var",2,sVar6);
      return 1;
    }
    local_1038 = 0x79;
    sVar6 = fwrite(&local_1038,4,2,__s);
    if (sVar6 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10b8,"ref_gather_scalar_plt","var",2,sVar6);
      return 1;
    }
    local_1038 = 0x7a;
    sVar6 = fwrite(&local_1038,4,2,__s);
    if (sVar6 != 2) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10bb,"ref_gather_scalar_plt","var",2,sVar6);
      return 1;
    }
    if (0 < (int)local_15b0) {
      local_1540 = local_15b0 & 0xffffffff;
      uVar12 = 0;
      do {
        if (scalar_names == (char **)0x0) {
          snprintf((char *)local_1438,1000,"V%d",(ulong)((int)uVar12 + 1));
          lVar10 = 1;
          do {
            cVar11 = local_1538[lVar10 + 0xff];
            local_1438[lVar10 + 0xff] = (int)cVar11;
            if (cVar11 == '\0') {
              uVar4 = 0;
              goto LAB_0014f844;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x401);
          uVar4 = 7;
          lVar10 = 0x400;
LAB_0014f844:
          iVar9 = (int)lVar10;
          if (cVar11 != '\0') {
            uVar7 = 0x10c1;
            uVar3 = uVar4;
            goto LAB_0014f85c;
          }
        }
        else {
          pcVar8 = scalar_names[uVar12];
          lVar10 = 1;
          do {
            cVar11 = pcVar8[lVar10 + -1];
            local_1438[lVar10 + 0xff] = (int)cVar11;
            if (cVar11 == '\0') {
              uVar4 = 0;
              goto LAB_0014f828;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x401);
          uVar4 = 7;
          lVar10 = 0x400;
LAB_0014f828:
          iVar9 = (int)lVar10;
          if (cVar11 != '\0') {
            uVar7 = 0x10c3;
            uVar3 = uVar4;
LAB_0014f85c:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar7,"ref_gather_scalar_plt",(ulong)uVar3,"a2i");
          }
        }
        if (cVar11 != '\0') {
          return uVar3;
        }
        __n = (size_t)iVar9;
        sVar6 = fwrite(&local_1038,4,__n,__s);
        if (sVar6 != __n) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x10c5,"ref_gather_scalar_plt","var",__n,sVar6);
          return 1;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_1540);
    }
  }
  else {
    __s = (FILE *)0x0;
  }
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"header vars");
  }
  uVar4 = ref_grid_faceid_range(ref_grid,(REF_INT *)&local_156c,&local_15b4);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x10cb
           ,"ref_gather_scalar_plt",(ulong)uVar4,"range");
    return uVar4;
  }
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"header faceid range");
  }
  uVar4 = local_156c;
  if ((int)local_156c <= local_15b4) {
    do {
      pRVar1 = ref_grid->mpi;
      local_157c = 0x43958000;
      local_1580 = 0xffffffff;
      local_1584 = 0xffffffff;
      local_1558 = 0;
      local_1588 = 0xffffffff;
      local_1590 = 0;
      local_1594 = 0;
      local_1598 = 0;
      local_15b8 = 0;
      local_15a4 = 0;
      local_158c = 2;
      uVar5 = ref_grid_compact_cell_id_nodes
                        (ref_grid,ref_grid->cell[3],uVar4,&local_1568,&local_1560,&local_1578);
      if (uVar5 == 0) {
        if (local_1560 < 1 || local_1568 < 1) {
LAB_0014e49c:
          uVar5 = 0;
          if (local_1578 != (REF_GLOB *)0x0) {
            free(local_1578);
          }
        }
        else {
          if (local_1568 < 0x80000000) {
            local_159c = (undefined4)local_1568;
            if (local_1560 < 0x80000000) {
              local_15a0 = (undefined4)local_1560;
              if (pRVar1->id == 0) {
                sVar6 = fwrite(&local_157c,4,1,__s);
                if (sVar6 == 1) {
                  snprintf(local_1538,0x100,"tri%d",(ulong)uVar4);
                  uVar12 = 1;
                  do {
                    cVar11 = local_1538[uVar12 - 1];
                    local_1438[uVar12 - 1] = (int)cVar11;
                    if (cVar11 == '\0') {
                      uVar5 = 0;
                      goto LAB_0014e794;
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != 0x101);
                  uVar5 = 7;
                  uVar12 = 0x100;
LAB_0014e794:
                  if (cVar11 == '\0') {
                    uVar12 = uVar12 & 0xffffffff;
                    sVar6 = fwrite(local_1438,4,uVar12,__s);
                    if (sVar6 == uVar12) {
                      sVar6 = fwrite(&local_1580,4,1,__s);
                      if (sVar6 == 1) {
                        sVar6 = fwrite(&local_1584,4,1,__s);
                        if (sVar6 == 1) {
                          sVar6 = fwrite(&local_1558,8,1,__s);
                          if (sVar6 == 1) {
                            sVar6 = fwrite(&local_1588,4,1,__s);
                            if (sVar6 == 1) {
                              sVar6 = fwrite(&local_158c,4,1,__s);
                              if (sVar6 == 1) {
                                sVar6 = fwrite(&local_1590,4,1,__s);
                                if (sVar6 == 1) {
                                  sVar6 = fwrite(&local_1594,4,1,__s);
                                  if (sVar6 == 1) {
                                    sVar6 = fwrite(&local_1598,4,1,__s);
                                    if (sVar6 == 1) {
                                      sVar6 = fwrite(&local_159c,4,1,__s);
                                      if (sVar6 == 1) {
                                        sVar6 = fwrite(&local_15a0,4,1,__s);
                                        if (sVar6 == 1) {
                                          sVar6 = fwrite(&local_15b8,4,1,__s);
                                          if (sVar6 == 1) {
                                            sVar6 = fwrite(&local_15b8,4,1,__s);
                                            if (sVar6 == 1) {
                                              sVar6 = fwrite(&local_15b8,4,1,__s);
                                              if (sVar6 == 1) {
                                                sVar6 = fwrite(&local_15a4,4,1,__s);
                                                if (sVar6 == 1) goto LAB_0014e49c;
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xe5e,"ref_gather_plt_tri_header","int",1,sVar6);
                                                uVar5 = 1;
                                              }
                                              else {
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xe5d,"ref_gather_plt_tri_header","int",1,sVar6);
                                                uVar5 = 1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xe5c,"ref_gather_plt_tri_header","int",1,sVar6);
                                              uVar5 = 1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xe5b,"ref_gather_plt_tri_header","int",1,sVar6);
                                            uVar5 = 1;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                 ,0xe5a,"ref_gather_plt_tri_header","int",1,sVar6);
                                          uVar5 = 1;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                               ,0xe59,"ref_gather_plt_tri_header","int",1,sVar6);
                                        uVar5 = 1;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                             ,0xe58,"ref_gather_plt_tri_header","int",1,sVar6);
                                      uVar5 = 1;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                           ,0xe57,"ref_gather_plt_tri_header","int",1,sVar6);
                                    uVar5 = 1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                         ,0xe56,"ref_gather_plt_tri_header","int",1,sVar6);
                                  uVar5 = 1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                       ,0xe55,"ref_gather_plt_tri_header","int",1,sVar6);
                                uVar5 = 1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0xe54,"ref_gather_plt_tri_header","int",1,sVar6);
                              uVar5 = 1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0xe53,"ref_gather_plt_tri_header","double",1,sVar6);
                            uVar5 = 1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0xe52,"ref_gather_plt_tri_header","int",1,sVar6);
                          uVar5 = 1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xe51,"ref_gather_plt_tri_header","int",1,sVar6);
                        uVar5 = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xe4f,"ref_gather_plt_tri_header","title",uVar12,sVar6);
                      uVar5 = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xe4e,"ref_gather_plt_tri_header",(ulong)uVar5,"a2i");
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xe4b,"ref_gather_plt_tri_header","zonemarker",1,sVar6);
                  uVar5 = 1;
                }
                goto LAB_0014e34d;
              }
              goto LAB_0014e49c;
            }
            uVar7 = 0xe47;
            pcVar8 = "too many tri for int";
          }
          else {
            uVar7 = 0xe45;
            pcVar8 = "too many nodes for int";
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar7,"ref_gather_plt_tri_header",pcVar8);
          uVar5 = 1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xe3f,"ref_gather_plt_tri_header",(ulong)uVar5,"l2c");
      }
LAB_0014e34d:
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10d0,"ref_gather_scalar_plt",(ulong)uVar5,"plt tri header");
        return uVar5;
      }
      pRVar1 = ref_grid->mpi;
      local_157c = 0x43958000;
      local_1580 = 0xffffffff;
      local_1584 = 0xffffffff;
      local_1558 = 0;
      local_1588 = 0xffffffff;
      local_1590 = 0;
      local_1594 = 0;
      local_1598 = 0;
      local_15b8 = 0;
      local_15a4 = 0;
      local_158c = 3;
      uVar5 = ref_grid_compact_cell_id_nodes
                        (ref_grid,ref_grid->cell[6],uVar4,&local_1568,&local_1560,&local_1578);
      if (uVar5 == 0) {
        if (local_1560 < 1 || local_1568 < 1) {
joined_r0x0014e61d:
          uVar5 = 0;
          if (local_1578 != (REF_GLOB *)0x0) {
            uVar5 = 0;
            free(local_1578);
          }
        }
        else {
          if (local_1568 < 0x80000000) {
            local_159c = (undefined4)local_1568;
            if (local_1560 < 0x80000000) {
              local_15a0 = (undefined4)local_1560;
              if (pRVar1->id == 0) {
                sVar6 = fwrite(&local_157c,4,1,__s);
                if (sVar6 == 1) {
                  snprintf(local_1538,0x100,"qua%d",(ulong)uVar4);
                  uVar12 = 1;
                  do {
                    cVar11 = local_1538[uVar12 - 1];
                    local_1438[uVar12 - 1] = (int)cVar11;
                    if (cVar11 == '\0') {
                      uVar5 = 0;
                      goto LAB_0014e7d6;
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != 0x101);
                  uVar5 = 7;
                  uVar12 = 0x100;
LAB_0014e7d6:
                  if (cVar11 == '\0') {
                    uVar12 = uVar12 & 0xffffffff;
                    sVar6 = fwrite(local_1438,4,uVar12,__s);
                    if (sVar6 == uVar12) {
                      sVar6 = fwrite(&local_1580,4,1,__s);
                      if (sVar6 == 1) {
                        sVar6 = fwrite(&local_1584,4,1,__s);
                        if (sVar6 == 1) {
                          sVar6 = fwrite(&local_1558,8,1,__s);
                          if (sVar6 == 1) {
                            sVar6 = fwrite(&local_1588,4,1,__s);
                            if (sVar6 == 1) {
                              sVar6 = fwrite(&local_158c,4,1,__s);
                              if (sVar6 == 1) {
                                sVar6 = fwrite(&local_1590,4,1,__s);
                                if (sVar6 == 1) {
                                  sVar6 = fwrite(&local_1594,4,1,__s);
                                  if (sVar6 == 1) {
                                    sVar6 = fwrite(&local_1598,4,1,__s);
                                    if (sVar6 == 1) {
                                      sVar6 = fwrite(&local_159c,4,1,__s);
                                      if (sVar6 == 1) {
                                        sVar6 = fwrite(&local_15a0,4,1,__s);
                                        if (sVar6 == 1) {
                                          sVar6 = fwrite(&local_15b8,4,1,__s);
                                          if (sVar6 == 1) {
                                            sVar6 = fwrite(&local_15b8,4,1,__s);
                                            if (sVar6 == 1) {
                                              sVar6 = fwrite(&local_15b8,4,1,__s);
                                              if (sVar6 == 1) {
                                                sVar6 = fwrite(&local_15a4,4,1,__s);
                                                if (sVar6 == 1) goto joined_r0x0014e61d;
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xe9f,"ref_gather_plt_qua_header","int",1,sVar6);
                                                uVar5 = 1;
                                              }
                                              else {
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xe9e,"ref_gather_plt_qua_header","int",1,sVar6);
                                                uVar5 = 1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xe9d,"ref_gather_plt_qua_header","int",1,sVar6);
                                              uVar5 = 1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                  ,0xe9c,"ref_gather_plt_qua_header","int",1,sVar6);
                                            uVar5 = 1;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                                 ,0xe9b,"ref_gather_plt_qua_header","int",1,sVar6);
                                          uVar5 = 1;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                               ,0xe9a,"ref_gather_plt_qua_header","int",1,sVar6);
                                        uVar5 = 1;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                             ,0xe99,"ref_gather_plt_qua_header","int",1,sVar6);
                                      uVar5 = 1;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                           ,0xe98,"ref_gather_plt_qua_header","int",1,sVar6);
                                    uVar5 = 1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                         ,0xe97,"ref_gather_plt_qua_header","int",1,sVar6);
                                  uVar5 = 1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                       ,0xe96,"ref_gather_plt_qua_header","int",1,sVar6);
                                uVar5 = 1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                     ,0xe95,"ref_gather_plt_qua_header","int",1,sVar6);
                              uVar5 = 1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0xe94,"ref_gather_plt_qua_header","double",1,sVar6);
                            uVar5 = 1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0xe93,"ref_gather_plt_qua_header","int",1,sVar6);
                          uVar5 = 1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xe92,"ref_gather_plt_qua_header","int",1,sVar6);
                        uVar5 = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xe90,"ref_gather_plt_qua_header","title",uVar12,sVar6);
                      uVar5 = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xe8f,"ref_gather_plt_qua_header",(ulong)uVar5,"a2i");
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xe8c,"ref_gather_plt_qua_header","zonemarker",1,sVar6);
                  uVar5 = 1;
                }
                goto LAB_0014e429;
              }
              goto joined_r0x0014e61d;
            }
            uVar7 = 0xe88;
            pcVar8 = "too many qua for int";
          }
          else {
            uVar7 = 0xe86;
            pcVar8 = "too many nodes for int";
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar7,"ref_gather_plt_qua_header",pcVar8);
          uVar5 = 1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xe80,"ref_gather_plt_qua_header",(ulong)uVar5,"l2c");
      }
LAB_0014e429:
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10d1,"ref_gather_scalar_plt",(ulong)uVar5,"plt qua header");
        return uVar5;
      }
      bVar2 = (int)uVar4 < local_15b4;
      uVar4 = uVar4 + 1;
    } while (bVar2);
  }
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"header surf");
  }
  if (local_1570 == 0) {
    uVar4 = ref_gather_plt_tet_header(ref_grid,(FILE *)__s);
    if (uVar4 != 0) {
      pcVar8 = "plt tet header";
      uVar7 = 0x10d9;
      uVar3 = uVar4;
      goto LAB_0014f97f;
    }
  }
  else {
    uVar4 = ref_gather_plt_brick_header(ref_grid,ref_grid->cell[8],(FILE *)__s);
    if (uVar4 != 0) {
      pcVar8 = "plt tet brick header";
      uVar7 = 0x10d7;
      uVar3 = uVar4;
LAB_0014f97f:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar7,"ref_gather_scalar_plt",(ulong)uVar3,pcVar8);
      uVar4 = uVar3;
    }
  }
  if (uVar4 != 0) {
    return uVar3;
  }
  uVar4 = ref_gather_plt_brick_header(ref_grid,ref_grid->cell[9],(FILE *)__s);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x10dc
           ,"ref_gather_scalar_plt",(ulong)uVar4,"plt pyr brick header");
    return uVar4;
  }
  uVar4 = ref_gather_plt_brick_header(ref_grid,ref_grid->cell[10],(FILE *)__s);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x10de
           ,"ref_gather_scalar_plt",(ulong)uVar4,"plt pri brick header");
    return uVar4;
  }
  uVar4 = ref_gather_plt_brick_header(ref_grid,ref_grid->cell[0xb],(FILE *)__s);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x10e0
           ,"ref_gather_scalar_plt",(ulong)uVar4,"plt hex brick header");
    return uVar4;
  }
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"header vol");
  }
  if ((ref_mpi->id == 0) && (sVar6 = fwrite(&local_1550,4,1,__s), sVar6 != 1)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x10e5
           ,"ref_gather_scalar_plt","eohmarker",1,sVar6);
    return 1;
  }
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"plt end of header");
  }
  uVar4 = local_156c;
  if ((int)local_156c <= local_15b4) {
    do {
      uVar5 = ref_gather_plt_tri_zone(ref_grid,uVar4,(REF_INT)local_15b0,scalar,(FILE *)__s);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10ec,"ref_gather_scalar_plt",(ulong)uVar5,"plt tri zone");
        return uVar5;
      }
      uVar5 = ref_gather_plt_qua_zone(ref_grid,uVar4,(REF_INT)local_15b0,scalar,(FILE *)__s);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10ee,"ref_gather_scalar_plt",(ulong)uVar5,"plt qua zone");
        return uVar5;
      }
      bVar2 = (int)uVar4 < local_15b4;
      uVar4 = uVar4 + 1;
    } while (bVar2);
  }
  if (0 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"surf zone");
  }
  if (local_1570 == 0) {
    uVar4 = ref_gather_plt_tet_zone(ref_grid,(REF_INT)local_15b0,scalar,(FILE *)__s);
    if (uVar4 == 0) goto LAB_0014fc8d;
    pcVar8 = "surf zone";
    uVar7 = 0x10f7;
    uVar3 = uVar4;
  }
  else {
    uVar4 = ref_gather_plt_brick_zone
                      (ref_grid,ref_grid->cell[8],(REF_INT)local_15b0,scalar,(FILE *)__s);
    if (uVar4 == 0) goto LAB_0014fc8d;
    pcVar8 = "plt tet brick zone";
    uVar7 = 0x10f5;
    uVar3 = uVar4;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
         "ref_gather_scalar_plt",(ulong)uVar3,pcVar8);
  uVar4 = uVar3;
LAB_0014fc8d:
  if (uVar4 == 0) {
    uVar3 = ref_gather_plt_brick_zone
                      (ref_grid,ref_grid->cell[9],(REF_INT)local_15b0,scalar,(FILE *)__s);
    if (uVar3 == 0) {
      uVar3 = ref_gather_plt_brick_zone
                        (ref_grid,ref_grid->cell[10],(REF_INT)local_15b0,scalar,(FILE *)__s);
      if (uVar3 == 0) {
        uVar3 = ref_gather_plt_brick_zone
                          (ref_grid,ref_grid->cell[0xb],(REF_INT)local_15b0,scalar,(FILE *)__s);
        if (uVar3 == 0) {
          if (0 < ref_mpi->timing) {
            ref_mpi_stopwatch_stop(ref_mpi,"vol zone");
          }
          uVar3 = 0;
          if (ref_mpi->id == 0) {
            fclose(__s);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1101,"ref_gather_scalar_plt",(ulong)uVar3,"plt hex brick zone");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x10fe,"ref_gather_scalar_plt",(ulong)uVar3,"plt pri brick zone");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10fb,"ref_gather_scalar_plt",(ulong)uVar3,"plt pyr brick zone");
    }
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_plt(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char **scalar_names,
                                                REF_BOOL as_brick,
                                                const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file = NULL;
  int one = 1;
  int filetype = 0;
  int ascii[1024];
  int i, len, numvar = 3 + ldim;
  float eohmarker = 357.0;
  REF_INT cell_id, min_faceid, max_faceid;

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "reset timing");

  RSS(ref_node_synchronize_globals(ref_node), "sync");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header sync global");

  if (ref_mpi_once(ref_mpi)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    REIS(8, fwrite(&"#!TDV112", sizeof(char), 8, file), "header");
    REIS(1, fwrite(&one, sizeof(int), 1, file), "magic");
    REIS(1, fwrite(&filetype, sizeof(int), 1, file), "filetype");

    ascii[0] = (int)'f';
    ascii[1] = (int)'t';
    ascii[2] = 0;
    REIS(3, fwrite(&ascii, sizeof(int), 3, file), "title");

    REIS(1, fwrite(&numvar, sizeof(int), 1, file), "numvar");
    ascii[0] = (int)'x';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    ascii[0] = (int)'y';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    ascii[0] = (int)'z';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    for (i = 0; i < ldim; i++) {
      len = 0;
      if (NULL == scalar_names) {
        char default_name[1000];
        snprintf(default_name, 1000, "V%d", i + 1);
        RSS(ref_gather_plt_char_int(default_name, 1024, &len, ascii), "a2i");
      } else {
        RSS(ref_gather_plt_char_int(scalar_names[i], 1024, &len, ascii), "a2i");
      }
      REIS(len, fwrite(&ascii, sizeof(int), (unsigned long)len, file), "var");
    }
  }

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header vars");
  RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header faceid range");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    RSS(ref_gather_plt_tri_header(ref_grid, cell_id, file), "plt tri header");
    RSS(ref_gather_plt_qua_header(ref_grid, cell_id, file), "plt qua header");
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header surf");
  if (as_brick) {
    RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_tet(ref_grid), file),
        "plt tet brick header");
  } else {
    RSS(ref_gather_plt_tet_header(ref_grid, file), "plt tet header");
  }
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_pyr(ref_grid), file),
      "plt pyr brick header");
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_pri(ref_grid), file),
      "plt pri brick header");
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_hex(ref_grid), file),
      "plt hex brick header");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header vol");

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&eohmarker, sizeof(float), 1, file), "eohmarker");
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt end of header");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    RSS(ref_gather_plt_tri_zone(ref_grid, cell_id, ldim, scalar, file),
        "plt tri zone");
    RSS(ref_gather_plt_qua_zone(ref_grid, cell_id, ldim, scalar, file),
        "plt qua zone");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "surf zone");

  if (as_brick) {
    RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_tet(ref_grid), ldim,
                                  scalar, file),
        "plt tet brick zone");
  } else {
    RSS(ref_gather_plt_tet_zone(ref_grid, ldim, scalar, file), "surf zone");
  }
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_pyr(ref_grid), ldim, scalar,
                                file),
      "plt pyr brick zone");
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_pri(ref_grid), ldim, scalar,
                                file),
      "plt pri brick zone");
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_hex(ref_grid), ldim, scalar,
                                file),
      "plt hex brick zone");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "vol zone");

  if (ref_mpi_once(ref_mpi)) {
    fclose(file);
  }

  return REF_SUCCESS;
}